

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,unsigned_long,fmt::v10::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  type tVar2;
  char *pcVar3;
  basic_string_view<char> local_2a0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_290;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_288;
  appender local_280 [3];
  allocator<char> local_261;
  undefined1 local_260 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *grouping_local;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  unsigned_long significand_local;
  appender out_local;
  
  bVar1 = digit_grouping<char>::has_separator(grouping);
  if (bVar1) {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_260,&local_261);
    std::allocator<char>::~allocator(&local_261);
    appender::back_insert_iterator(local_280,(buffer<char> *)local_260);
    local_288.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,_unsigned_long,_char,_0>
                   (local_280[0],significand,significand_size,integral_size,decimal_point);
    local_290 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    pcVar3 = buffer<char>::data((buffer<char> *)local_260);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char>::basic_string_view(&local_2a0,pcVar3,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v10::appender,char>
              (grouping,(appender)local_290.container,local_2a0);
    pcVar3 = buffer<char>::data((buffer<char> *)local_260);
    out_local = copy_str_noinline<char,char*,fmt::v10::appender>
                          (pcVar3 + integral_size,(char *)(buffer._0_8_ + buffer._8_8_),out);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_260);
  }
  else {
    buffer._528_8_ = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    out_local = write_significand<fmt::v10::appender,_unsigned_long,_char,_0>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}